

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_size_invalid_sampler
               (NegativeTestContext *ctx)

{
  DataType dataType;
  bool bVar1;
  bool bVar2;
  ContextType CVar3;
  char *pcVar4;
  long *plVar5;
  size_t sVar6;
  ostream *poVar7;
  ShaderType SVar8;
  size_type *psVar9;
  DataType dataType_00;
  DataType dataType_01;
  long lVar10;
  uint uVar11;
  string shaderSource;
  ostringstream source;
  string local_2d8;
  ShaderType local_2b4;
  string local_2b0;
  string local_290;
  string local_270;
  long *local_250;
  long local_248;
  long local_240 [2];
  string local_230;
  string local_210;
  long local_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,
             "textureSize: Invalid sampler type - some overloads take two arguments while others take only one."
             ,"");
  NegativeTestContext::beginSection(ctx,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  lVar10 = 0;
  do {
    SVar8 = (&(anonymous_namespace)::s_shaders)[lVar10];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,SVar8);
    if (bVar1) {
      local_2b4 = SVar8;
      pcVar4 = glu::getShaderTypeName(SVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,pcVar4,(allocator<char> *)&local_1c8);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x9ba7d3);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_1a8[0].field_2._0_8_ = *psVar9;
        local_1a8[0].field_2._8_8_ = plVar5[3];
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      }
      else {
        local_1a8[0].field_2._0_8_ = *psVar9;
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1a8[0]._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      NegativeTestContext::beginSection(ctx,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_1f0 = lVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      lVar10 = 0;
      do {
        CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
        bVar1 = true;
        if (!bVar2) {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1e8,
                     (_anonymous_namespace_ *)
                     (ulong)*(uint *)((long)&(anonymous_namespace)::s_samplerTypes + lVar10),
                     dataType_00);
          bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar1 != false) {
          dataType = *(DataType *)((long)&(anonymous_namespace)::s_samplerTypes + lVar10);
          pcVar4 = glu::getDataTypeName(dataType);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d8,pcVar4,(allocator<char> *)&local_1c8);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x9bc796);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_1a8[0].field_2._0_8_ = *psVar9;
            local_1a8[0].field_2._8_8_ = plVar5[3];
          }
          else {
            local_1a8[0].field_2._0_8_ = *psVar9;
            local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1a8[0]._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          NegativeTestContext::beginSection(ctx,local_1a8);
          SVar8 = (ShaderType)psVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
          bVar1 = glu::contextSupports(CVar3,(ApiType)0x23);
          pcVar4 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)&local_2d8 +
                            (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x130);
          }
          else {
            sVar6 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1c8,(_anonymous_namespace_ *)(ulong)dataType,dataType_01);
          getShaderExtensionDeclaration(&local_2d8,&local_1c8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_2d8._M_dataplus._M_p,
                              local_2d8._M_string_length);
          (anonymous_namespace)::getShaderInitialization_abi_cxx11_
                    (&local_210,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)local_2b4
                     ,SVar8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_210._M_dataplus._M_p,local_210._M_string_length);
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          local_290.field_2._M_allocated_capacity._0_4_ = 0x706d6173;
          local_290._M_string_length = 7;
          local_290.field_2._M_allocated_capacity._4_4_ = 0x72656c;
          declareShaderUniform(&local_230,dataType,&local_290);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_230._M_dataplus._M_p,local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main(void)\n",0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,
                            CONCAT44(local_290.field_2._M_allocated_capacity._4_4_,
                                     local_290.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          uVar11 = dataType - TYPE_SAMPLER_2D;
          if (uVar11 < 0x33) {
            if ((0x3b76dbbUL >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
              if ((0x7e0001c000000U >> ((ulong)uVar11 & 0x3f) & 1) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
                local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
                local_2b0.field_2._M_local_buf[2] = 'd';
                local_2b0.field_2._M_allocated_capacity._0_2_ = 0x6f6c;
                local_2b0._M_string_length = 3;
                local_2b0.field_2._M_local_buf[3] = '\0';
                declareAndInitializeShaderVariable(&local_2d8,TYPE_INT,&local_2b0);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_2d8._M_dataplus._M_p,
                                    local_2d8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"    textureSize(sampler, lod);\n",0x1f);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                  operator_delete(local_2d8._M_dataplus._M_p,
                                  local_2d8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                  operator_delete(local_2b0._M_dataplus._M_p,
                                  CONCAT44(local_2b0.field_2._M_allocated_capacity._4_4_,
                                           CONCAT13(local_2b0.field_2._M_local_buf[3],
                                                    CONCAT12(local_2b0.field_2._M_local_buf[2],
                                                             local_2b0.field_2._M_allocated_capacity
                                                             ._0_2_))) + 1);
                }
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"    textureSize(sampler);\n",0x1a);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_270,local_250,local_248 + (long)local_250);
          verifyShader(ctx,local_2b4,&local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          NegativeTestContext::endSection(ctx);
          if (local_250 != local_240) {
            operator_delete(local_250,local_240[0] + 1);
          }
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x70);
      NegativeTestContext::endSection(ctx);
      lVar10 = local_1f0;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_size_invalid_sampler (NegativeTestContext& ctx)
{
	ctx.beginSection("textureSize: Invalid sampler type - some overloads take two arguments while others take only one.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_samplerTypes); ++dataTypeNdx)
			{
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(s_samplerTypes[dataTypeNdx])))
				{
					ctx.beginSection("Verify sampler data type: " + std::string(getDataTypeName(s_samplerTypes[dataTypeNdx])));
					const std::string shaderSource(genShaderSourceTextureSize_sampler(ctx, s_shaders[shaderNdx], s_samplerTypes[dataTypeNdx], glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					ctx.endSection();
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}